

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_rescale(secp256k1_gej *r,secp256k1_fe *s)

{
  int iVar1;
  secp256k1_fe zz;
  secp256k1_fe *in_stack_ffffffffffffffb8;
  secp256k1_gej *in_stack_ffffffffffffffc0;
  
  secp256k1_gej_verify(in_stack_ffffffffffffffc0);
  secp256k1_fe_verify(&in_stack_ffffffffffffffc0->x);
  iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x12835c);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/group_impl.h"
            ,0x33c,"test condition failed: !secp256k1_fe_normalizes_to_zero_var(s)");
    abort();
  }
  secp256k1_fe_sqr(&in_stack_ffffffffffffffc0->x,in_stack_ffffffffffffffb8);
  secp256k1_fe_mul(&in_stack_ffffffffffffffc0->x,in_stack_ffffffffffffffb8,(secp256k1_fe *)0x1283ca)
  ;
  secp256k1_fe_mul(&in_stack_ffffffffffffffc0->x,in_stack_ffffffffffffffb8,(secp256k1_fe *)0x1283e6)
  ;
  secp256k1_fe_mul(&in_stack_ffffffffffffffc0->x,in_stack_ffffffffffffffb8,(secp256k1_fe *)0x128402)
  ;
  secp256k1_fe_mul(&in_stack_ffffffffffffffc0->x,in_stack_ffffffffffffffb8,(secp256k1_fe *)0x12841e)
  ;
  secp256k1_gej_verify(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

static void secp256k1_gej_rescale(secp256k1_gej *r, const secp256k1_fe *s) {
    /* Operations: 4 mul, 1 sqr */
    secp256k1_fe zz;
    SECP256K1_GEJ_VERIFY(r);
    SECP256K1_FE_VERIFY(s);
    VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(s));

    secp256k1_fe_sqr(&zz, s);
    secp256k1_fe_mul(&r->x, &r->x, &zz);                /* r->x *= s^2 */
    secp256k1_fe_mul(&r->y, &r->y, &zz);
    secp256k1_fe_mul(&r->y, &r->y, s);                  /* r->y *= s^3 */
    secp256k1_fe_mul(&r->z, &r->z, s);                  /* r->z *= s   */

    SECP256K1_GEJ_VERIFY(r);
}